

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

void __thiscall AixLog::SinkCout::~SinkCout(SinkCout *this)

{
  SinkFormat::~SinkFormat(&this->super_SinkFormat);
  operator_delete(this,0x58);
  return;
}

Assistant:

SinkCout(const Filter& filter,
           const std::string& format =
               "%Y-%m-%d %H-%M-%S.#ms [#severity] (#tag_func)")
      : SinkFormat(filter, format) {}